

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void __thiscall
crnlib::vector<unsigned_char>::reserve(vector<unsigned_char> *this,uint new_capacity)

{
  uint uVar1;
  uint in_ESI;
  vector<unsigned_char> *in_RDI;
  vector<unsigned_char> tmp;
  undefined2 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffba;
  undefined1 in_stack_ffffffffffffffbb;
  uint in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  vector<unsigned_char> local_20;
  uint local_c;
  
  if (in_RDI->m_capacity < in_ESI) {
    increase_capacity((vector<unsigned_char> *)
                      CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffbc,(bool)in_stack_ffffffffffffffbb,
                      (bool)in_stack_ffffffffffffffba);
  }
  else if (in_ESI < in_RDI->m_capacity) {
    local_c = in_ESI;
    vector(&local_20);
    uVar1 = math::maximum<unsigned_int>(in_RDI->m_size,local_c);
    increase_capacity((vector<unsigned_char> *)CONCAT44(uVar1,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffbc,(bool)in_stack_ffffffffffffffbb,
                      (bool)in_stack_ffffffffffffffba);
    operator=(in_RDI,(vector<unsigned_char> *)CONCAT44(uVar1,in_stack_ffffffffffffffc0));
    swap((vector<unsigned_char> *)CONCAT44(uVar1,in_stack_ffffffffffffffc0),
         (vector<unsigned_char> *)
         CONCAT44(in_stack_ffffffffffffffbc,
                  CONCAT13(in_stack_ffffffffffffffbb,
                           CONCAT12(in_stack_ffffffffffffffba,in_stack_ffffffffffffffb8))));
    ~vector((vector<unsigned_char> *)CONCAT44(uVar1,in_stack_ffffffffffffffc0));
  }
  return;
}

Assistant:

inline void reserve(uint new_capacity) {
    if (new_capacity > m_capacity)
      increase_capacity(new_capacity, false);
    else if (new_capacity < m_capacity) {
      // Must work around the lack of a "decrease_capacity()" method.
      // This case is rare enough in practice that it's probably not worth implementing an optimized in-place resize.
      vector tmp;
      tmp.increase_capacity(math::maximum(m_size, new_capacity), false);
      tmp = *this;
      swap(tmp);
    }
  }